

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O3

IMesh * __thiscall
irr::scene::CAnimatedMeshSceneNode::getMeshForCurrentFrame(CAnimatedMeshSceneNode *this)

{
  CSkinnedMesh *this_00;
  int iVar1;
  E_JOINT_UPDATE_ON_RENDER EVar2;
  undefined4 extraout_var;
  pointer ppIVar3;
  pointer ppIVar4;
  ulong uVar5;
  float fVar6;
  float __x;
  float fVar7;
  undefined4 uVar8;
  
  iVar1 = (*(this->Mesh->super_IMesh)._vptr_IMesh[7])();
  if (iVar1 == 0xb) {
    this_00 = (CSkinnedMesh *)this->Mesh;
    if (this->JointMode == EJUOR_CONTROL) {
      CSkinnedMesh::transferJointsToMesh(this_00,&this->JointChildSceneNodes);
    }
    else {
      uVar8 = (**(code **)(*(long *)this + 0x158))(this);
      (**(code **)(*(long *)this_00 + 0xa0))(uVar8,0x3f800000,this_00);
    }
    (**(code **)(*(long *)this_00 + 0xa8))(this_00);
    EVar2 = this->JointMode;
    if (EVar2 == EJUOR_READ) {
      CSkinnedMesh::recoverJointsFromMesh(this_00,&this->JointChildSceneNodes);
      ppIVar3 = (this->JointChildSceneNodes).m_data.
                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar4 = (this->JointChildSceneNodes).m_data.
                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)ppIVar4 - (long)ppIVar3) >> 3) != 0) {
        uVar5 = 0;
        do {
          if ((CAnimatedMeshSceneNode *)(ppIVar3[uVar5]->super_ISceneNode).Parent == this) {
            (**(code **)((long)(ppIVar3[uVar5]->super_ISceneNode)._vptr_ISceneNode + 0x148))();
            ppIVar3 = (this->JointChildSceneNodes).m_data.
                      super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppIVar4 = (this->JointChildSceneNodes).m_data.
                      super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < ((ulong)((long)ppIVar4 - (long)ppIVar3) >> 3 & 0xffffffff));
      }
      EVar2 = this->JointMode;
    }
    if (EVar2 == EJUOR_CONTROL) {
      (**(code **)(*(long *)this_00 + 0x128))(this_00);
    }
    return (IMesh *)this_00;
  }
  fVar6 = (float)(**(code **)(*(long *)this + 0x158))(this);
  __x = (float)(**(code **)(*(long *)this + 0x158))(this);
  fVar7 = floorf(__x);
  iVar1 = (*(this->Mesh->super_IMesh)._vptr_IMesh[0xd])
                    (this->Mesh,(ulong)(uint)(int)fVar6,(ulong)(uint)(int)((__x - fVar7) * 1000.0),
                     (ulong)(uint)this->StartFrame,(ulong)(uint)this->EndFrame);
  return (IMesh *)CONCAT44(extraout_var,iVar1);
}

Assistant:

IMesh *CAnimatedMeshSceneNode::getMeshForCurrentFrame()
{
	if (Mesh->getMeshType() != EAMT_SKINNED) {
		s32 frameNr = (s32)getFrameNr();
		s32 frameBlend = (s32)(core::fract(getFrameNr()) * 1000.f);
		return Mesh->getMesh(frameNr, frameBlend, StartFrame, EndFrame);
	} else {
		// As multiple scene nodes may be sharing the same skinned mesh, we have to
		// re-animate it every frame to ensure that this node gets the mesh that it needs.

		CSkinnedMesh *skinnedMesh = static_cast<CSkinnedMesh *>(Mesh);

		if (JointMode == EJUOR_CONTROL) // write to mesh
			skinnedMesh->transferJointsToMesh(JointChildSceneNodes);
		else
			skinnedMesh->animateMesh(getFrameNr(), 1.0f);

		// Update the skinned mesh for the current joint transforms.
		skinnedMesh->skinMesh();

		if (JointMode == EJUOR_READ) { // read from mesh
			skinnedMesh->recoverJointsFromMesh(JointChildSceneNodes);

			//---slow---
			for (u32 n = 0; n < JointChildSceneNodes.size(); ++n)
				if (JointChildSceneNodes[n]->getParent() == this) {
					JointChildSceneNodes[n]->updateAbsolutePositionOfAllChildren(); // temp, should be an option
				}
		}

		if (JointMode == EJUOR_CONTROL) {
			// For meshes other than EJUOR_CONTROL, this is done by calling animateMesh()
			skinnedMesh->updateBoundingBox();
		}

		return skinnedMesh;
	}
}